

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

void __thiscall ON_SerialNumberMap::Internal_HashTableGrow(ON_SerialNumberMap *this)

{
  SN_ELEMENT ***pppSVar1;
  SN_ELEMENT **ppSVar2;
  uint local_48;
  size_t sizeof_hash_table_block;
  ON__UINT32 hash_block_count;
  ON__UINT64 max_hash_block_count;
  ulong uStack_18;
  ON__UINT32 target_linked_list_length;
  ON__UINT64 sz;
  ON_SerialNumberMap *this_local;
  
  if ((this->m_hash_capacity <= this->m_active_id_count) && (this->m_hash_block_count < 0xffa)) {
    for (uStack_18 = (ulong)(this->m_hash_block_count << 1);
        uStack_18 * 0x3fe8 < this->m_active_id_count ||
        uStack_18 * 0x3fe8 - this->m_active_id_count == 0; uStack_18 = uStack_18 + 1) {
    }
    if (uStack_18 < 0xffa) {
      local_48 = (uint)uStack_18;
    }
    else {
      local_48 = 0xffa;
    }
    sizeof_hash_table_block._4_4_ = local_48;
    if (local_48 == 0) {
      sizeof_hash_table_block._4_4_ = 1;
    }
    if (this->m_hash_block_count < sizeof_hash_table_block._4_4_) {
      if (this->m_hash_block_count == 0) {
        pppSVar1 = (SN_ELEMENT ***)onmalloc(0xffa0);
        this->m_hash_table_blocks = pppSVar1;
        *this->m_hash_table_blocks = (SN_ELEMENT **)(this->m_hash_table_blocks + 0xffa);
        this->m_hash_block_count = 1;
      }
      while (this->m_hash_block_count < sizeof_hash_table_block._4_4_) {
        ppSVar2 = (SN_ELEMENT **)onmalloc(0x7fd0);
        this->m_hash_table_blocks[this->m_hash_block_count] = ppSVar2;
        if (this->m_hash_table_blocks[this->m_hash_block_count] == (SN_ELEMENT **)0x0) break;
        this->m_hash_block_count = this->m_hash_block_count + 1;
      }
      this->m_hash_capacity = 0x3fe8;
      this->m_hash_capacity = (ulong)this->m_hash_block_count * this->m_hash_capacity;
      if ((this->m_bHashTableIsValid != '\0') || (this->m_active_id_count == 0)) {
        Internal_HashTableInvalidate(this);
        Internal_HashTableInitialize(this);
      }
    }
  }
  return;
}

Assistant:

void ON_SerialNumberMap::Internal_HashTableGrow() const
{
  if (m_active_id_count >= m_hash_capacity && m_hash_block_count < ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY)
  {
    // Add capacity to the hash table.

    ON__UINT64 sz = (2U*m_hash_block_count);
    const ON__UINT32 target_linked_list_length = 4U;
    while (sz*((ON__UINT64)(target_linked_list_length*ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY)) <= m_active_id_count)
      sz++;
    const ON__UINT64 max_hash_block_count = (ON__UINT64)ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY;
    ON__UINT32 hash_block_count = (ON__UINT32)((sz < max_hash_block_count) ? sz : max_hash_block_count);
    if ( 0 == hash_block_count )
      hash_block_count = 1;
    if (m_hash_block_count < hash_block_count )
    {
      const size_t sizeof_hash_table_block = ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY*sizeof(m_hash_table_blocks[0][0]);
      if (0 == m_hash_block_count)
      {
        m_hash_table_blocks = (SN_ELEMENT***)onmalloc(2 * sizeof_hash_table_block);
        m_hash_table_blocks[0] = (SN_ELEMENT**)(m_hash_table_blocks + ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY);
        m_hash_block_count = 1;
      }
      while (m_hash_block_count < hash_block_count)
      {
        m_hash_table_blocks[m_hash_block_count] = (SN_ELEMENT**)onmalloc(sizeof_hash_table_block);
        if (nullptr == m_hash_table_blocks[m_hash_block_count])
          break;
        m_hash_block_count++;
      }

      m_hash_capacity = target_linked_list_length*ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY;
      m_hash_capacity *= m_hash_block_count;
      if (m_bHashTableIsValid || 0 == m_active_id_count)
      {
        // Invalidate() is necessary in order for Initialize()
        // to rebuild the has information.
        const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();
        Internal_HashTableInitialize();
      }
    }
  }
}